

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O1

void __thiscall
flatbuffers::vector_downward<unsigned_int>::clear_buffer(vector_downward<unsigned_int> *this)

{
  uint8_t *puVar1;
  Allocator *pAVar2;
  
  puVar1 = this->buf_;
  if (puVar1 != (uint8_t *)0x0) {
    pAVar2 = this->allocator_;
    if (pAVar2 == (Allocator *)0x0) {
      operator_delete__(puVar1);
    }
    else {
      (*pAVar2->_vptr_Allocator[3])(pAVar2,puVar1,this->reserved_);
    }
  }
  this->buf_ = (uint8_t *)0x0;
  return;
}

Assistant:

void clear_buffer() {
    if (buf_) Deallocate(allocator_, buf_, reserved_);
    buf_ = nullptr;
  }